

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase107::run(TestCase107 *this)

{
  bool bVar1;
  uint64_t uVar2;
  bool local_d79;
  undefined1 auStack_d78 [7];
  bool _kj_shouldLog_12;
  Maybe<capnp::StructSchema::Field> local_d68;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_d20;
  undefined1 local_cd8 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_12;
  undefined1 auStack_c68 [7];
  bool _kj_shouldLog_11;
  Maybe<capnp::StructSchema::Field> local_c58;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_c10;
  undefined1 local_bc8 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_11;
  undefined1 auStack_b58 [7];
  bool _kj_shouldLog_10;
  Maybe<capnp::StructSchema::Field> local_b48;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_b00;
  undefined1 local_ab8 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_10;
  undefined1 auStack_a48 [7];
  bool _kj_shouldLog_9;
  Maybe<capnp::StructSchema::Field> local_a38;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_9f0;
  undefined1 local_9a8 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_9;
  undefined1 auStack_938 [7];
  bool _kj_shouldLog_8;
  Maybe<capnp::StructSchema::Field> local_928;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_8e0;
  undefined1 local_898 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_8;
  undefined1 auStack_828 [7];
  bool _kj_shouldLog_7;
  Maybe<capnp::StructSchema::Field> local_818;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_7d0;
  undefined1 local_788 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_7;
  undefined1 auStack_718 [7];
  bool _kj_shouldLog_6;
  Maybe<capnp::StructSchema::Field> local_708;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_6c0;
  undefined1 local_678 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_6;
  Schema SStack_608;
  bool _kj_shouldLog_5;
  StructSchema local_600;
  undefined1 local_5f8 [8];
  DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> _kjCondition_5;
  ArrayPtr<const_char> local_5a0;
  bool local_589;
  undefined1 local_588 [7];
  bool _kj_shouldLog_4;
  ArrayPtr<const_char> local_558;
  char (*local_548) [7];
  undefined1 local_540 [8];
  DebugComparison<const_char_(&)[7],_capnp::Text::Reader> _kjCondition_4;
  undefined1 local_500 [8];
  Field u1f0s8;
  undefined1 auStack_4b8 [7];
  bool _kj_shouldLog_3;
  Maybe<capnp::StructSchema::Field> local_4a8;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_460;
  undefined1 local_418 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_3;
  Schema local_380;
  bool local_371;
  undefined1 local_370 [7];
  bool _kj_shouldLog_2;
  Schema local_340;
  StructSchema *local_338;
  undefined1 local_330 [8];
  DebugComparison<capnp::StructSchema_&,_capnp::Schema> _kjCondition_2;
  Reader local_2d8;
  Schema local_2a8;
  Schema local_2a0;
  StructSchema union1g;
  undefined1 local_288 [8];
  Field union1;
  undefined1 auStack_240 [7];
  bool _kj_shouldLog_1;
  Maybe<capnp::StructSchema::Field> local_230;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_1e8;
  undefined1 local_1a0 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_1;
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_128;
  Maybe<capnp::StructSchema::Field> local_118;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_d0;
  undefined1 local_88 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition;
  Schema local_18;
  StructSchema schema;
  TestCase107 *this_local;
  
  schema.super_Schema.raw = (Schema)(Schema)this;
  _kjCondition._96_8_ = Schema::from<capnproto_test::capnp::test::TestUnion>();
  local_18.raw = (RawBrandedSchema *)Schema::asStruct((Schema *)&_kjCondition.result);
  kj::StringPtr::StringPtr((StringPtr *)&local_128,"bit0");
  StructSchema::findFieldByName(&local_118,(StructSchema *)&local_18,(StringPtr)local_128);
  kj::_::DebugExpressionStart::operator<<
            (&local_d0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_118);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator!=
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_88,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_d0,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_d0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_118);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_88);
  if (!bVar1) {
    _kjCondition_1._99_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._99_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x6e,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"bit0\\\") != kj::none\", _kjCondition"
                 ,(char (*) [60])"failed: expected schema.findFieldByName(\"bit0\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_88);
      _kjCondition_1._99_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_88);
  kj::StringPtr::StringPtr((StringPtr *)auStack_240,"u1f0s8");
  StructSchema::findFieldByName(&local_230,(StructSchema *)&local_18,(StringPtr)_auStack_240);
  kj::_::DebugExpressionStart::operator<<
            (&local_1e8,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_230);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator==
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_1a0,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_1e8,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_1e8);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_230);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a0);
  if (!bVar1) {
    union1.proto._reader._47_1_ = kj::_::Debug::shouldLog(ERROR);
    while (union1.proto._reader._47_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[62],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x6f,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"u1f0s8\\\") == kj::none\", _kjCondition"
                 ,(char (*) [62])"failed: expected schema.findFieldByName(\"u1f0s8\") == kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_1a0);
      union1.proto._reader._47_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_1a0);
  kj::StringPtr::StringPtr((StringPtr *)&union1g,"union1");
  StructSchema::getFieldByName((Field *)local_288,(StructSchema *)&local_18,(StringPtr)_union1g);
  StructSchema::Field::getProto((Reader *)&_kjCondition_2.result,(Field *)local_288);
  capnp::schema::Field::Reader::getGroup(&local_2d8,(Reader *)&_kjCondition_2.result);
  uVar2 = capnp::schema::Field::Group::Reader::getTypeId(&local_2d8);
  local_2a8 = Schema::getDependency(&local_18,uVar2);
  local_2a0.raw = (RawBrandedSchema *)Schema::asStruct(&local_2a8);
  local_338 = (StructSchema *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(StructSchema *)&local_18);
  Schema::getProto((Reader *)local_370,&local_2a0);
  uVar2 = capnp::schema::Node::Reader::getScopeId((Reader *)local_370);
  local_340 = Schema::getDependency(&local_2a0,uVar2);
  kj::_::DebugExpression<capnp::StructSchema&>::operator==
            ((DebugComparison<capnp::StructSchema_&,_capnp::Schema> *)local_330,
             (DebugExpression<capnp::StructSchema&> *)&local_338,&local_340);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_330);
  if (!bVar1) {
    local_371 = kj::_::Debug::shouldLog(ERROR);
    while (local_371 != false) {
      Schema::getProto((Reader *)&_kjCondition_3.result,&local_2a0);
      uVar2 = capnp::schema::Node::Reader::getScopeId((Reader *)&_kjCondition_3.result);
      local_380 = Schema::getDependency(&local_2a0,uVar2);
      kj::_::Debug::
      log<char_const(&)[86],kj::_::DebugComparison<capnp::StructSchema&,capnp::Schema>&,capnp::StructSchema&,capnp::Schema>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x73,ERROR,
                 "\"failed: expected \" \"(schema) == (union1g.getDependency(union1g.getProto().getScopeId()))\", _kjCondition, schema, union1g.getDependency(union1g.getProto().getScopeId())"
                 ,(char (*) [86])
                  "failed: expected (schema) == (union1g.getDependency(union1g.getProto().getScopeId()))"
                 ,(DebugComparison<capnp::StructSchema_&,_capnp::Schema> *)local_330,
                 (StructSchema *)&local_18,&local_380);
      local_371 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_4b8,"bin0");
  StructSchema::findFieldByName(&local_4a8,(StructSchema *)&local_2a0,(StringPtr)_auStack_4b8);
  kj::_::DebugExpressionStart::operator<<
            (&local_460,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_4a8);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator==
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_418,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_460,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_460);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_4a8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_418);
  if (!bVar1) {
    u1f0s8.proto._reader._47_1_ = kj::_::Debug::shouldLog(ERROR);
    while (u1f0s8.proto._reader._47_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x74,ERROR,
                 "\"failed: expected \" \"union1g.findFieldByName(\\\"bin0\\\") == kj::none\", _kjCondition"
                 ,(char (*) [61])"failed: expected union1g.findFieldByName(\"bin0\") == kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_418);
      u1f0s8.proto._reader._47_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_418);
  kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_4.result,"u1f0s8");
  StructSchema::getFieldByName
            ((Field *)local_500,(StructSchema *)&local_2a0,(StringPtr)stack0xfffffffffffffaf0);
  local_548 = (char (*) [7])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [7])"u1f0s8");
  StructSchema::Field::getProto((Reader *)local_588,(Field *)local_500);
  local_558 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_588);
  kj::_::DebugExpression<char_const(&)[7]>::operator==
            ((DebugComparison<const_char_(&)[7],_capnp::Text::Reader> *)local_540,
             (DebugExpression<char_const(&)[7]> *)&local_548,(Reader *)&local_558);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_540);
  if (!bVar1) {
    local_589 = kj::_::Debug::shouldLog(ERROR);
    while (local_589 != false) {
      StructSchema::Field::getProto((Reader *)&_kjCondition_5.result,(Field *)local_500);
      local_5a0 = (ArrayPtr<const_char>)
                  capnp::schema::Field::Reader::getName((Reader *)&_kjCondition_5.result);
      kj::_::Debug::
      log<char_const(&)[61],kj::_::DebugComparison<char_const(&)[7],capnp::Text::Reader>&,char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x77,ERROR,
                 "\"failed: expected \" \"(\\\"u1f0s8\\\") == (u1f0s8.getProto().getName())\", _kjCondition, \"u1f0s8\", u1f0s8.getProto().getName()"
                 ,(char (*) [61])"failed: expected (\"u1f0s8\") == (u1f0s8.getProto().getName())",
                 (DebugComparison<const_char_(&)[7],_capnp::Text::Reader> *)local_540,
                 (char (*) [7])"u1f0s8",(Reader *)&local_5a0);
      local_589 = false;
    }
  }
  SStack_608.raw = (RawBrandedSchema *)StructSchema::Field::getContainingStruct((Field *)local_500);
  local_600.super_Schema.raw =
       (Schema)kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (StructSchema *)&stack0xfffffffffffff9f8);
  kj::_::DebugExpression<capnp::StructSchema>::operator==
            ((DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> *)local_5f8,
             (DebugExpression<capnp::StructSchema> *)&local_600,(StructSchema *)&local_2a0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5f8);
  if (!bVar1) {
    _kjCondition_6._103_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_6._103_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[57],kj::_::DebugComparison<capnp::StructSchema,capnp::StructSchema&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x78,ERROR,
                 "\"failed: expected \" \"u1f0s8.getContainingStruct() == union1g\", _kjCondition",
                 (char (*) [57])"failed: expected u1f0s8.getContainingStruct() == union1g",
                 (DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> *)local_5f8);
      _kjCondition_6._103_1_ = 0;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_718,"u1f1s8");
  StructSchema::findFieldByName(&local_708,(StructSchema *)&local_2a0,(StringPtr)_auStack_718);
  kj::_::DebugExpressionStart::operator<<
            (&local_6c0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_708);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator!=
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_678,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_6c0,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_6c0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_708);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_678);
  if (!bVar1) {
    _kjCondition_7._103_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_7._103_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x7a,ERROR,
                 "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f1s8\\\") != kj::none\", _kjCondition"
                 ,(char (*) [63])"failed: expected union1g.findFieldByName(\"u1f1s8\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_678);
      _kjCondition_7._103_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_678);
  kj::StringPtr::StringPtr((StringPtr *)auStack_828,"u1f0s32");
  StructSchema::findFieldByName(&local_818,(StructSchema *)&local_2a0,(StringPtr)_auStack_828);
  kj::_::DebugExpressionStart::operator<<
            (&local_7d0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_818);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator!=
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_788,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_7d0,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_7d0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_818);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_788);
  if (!bVar1) {
    _kjCondition_8._103_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_8._103_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[64],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x7b,ERROR,
                 "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f0s32\\\") != kj::none\", _kjCondition"
                 ,(char (*) [64])"failed: expected union1g.findFieldByName(\"u1f0s32\") != kj::none"
                 ,(DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                  local_788);
      _kjCondition_8._103_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_788);
  kj::StringPtr::StringPtr((StringPtr *)auStack_938,"u1f0sp");
  StructSchema::findFieldByName(&local_928,(StructSchema *)&local_2a0,(StringPtr)_auStack_938);
  kj::_::DebugExpressionStart::operator<<
            (&local_8e0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_928);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator!=
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_898,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_8e0,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_8e0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_928);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_898);
  if (!bVar1) {
    _kjCondition_9._103_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_9._103_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x7c,ERROR,
                 "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f0sp\\\") != kj::none\", _kjCondition"
                 ,(char (*) [63])"failed: expected union1g.findFieldByName(\"u1f0sp\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_898);
      _kjCondition_9._103_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_898);
  kj::StringPtr::StringPtr((StringPtr *)auStack_a48,"u1f1s1");
  StructSchema::findFieldByName(&local_a38,(StructSchema *)&local_2a0,(StringPtr)_auStack_a48);
  kj::_::DebugExpressionStart::operator<<
            (&local_9f0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_a38);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator!=
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_9a8,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_9f0,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_9f0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_a38);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_9a8);
  if (!bVar1) {
    _kjCondition_10._103_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_10._103_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x7d,ERROR,
                 "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f1s1\\\") != kj::none\", _kjCondition"
                 ,(char (*) [63])"failed: expected union1g.findFieldByName(\"u1f1s1\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_9a8);
      _kjCondition_10._103_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_9a8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_b58,"u0f0s1");
  StructSchema::findFieldByName(&local_b48,(StructSchema *)&local_2a0,(StringPtr)_auStack_b58);
  kj::_::DebugExpressionStart::operator<<
            (&local_b00,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b48);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator==
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_ab8,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_b00,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_b00);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_b48);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_ab8);
  if (!bVar1) {
    _kjCondition_11._103_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_11._103_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x7f,ERROR,
                 "\"failed: expected \" \"union1g.findFieldByName(\\\"u0f0s1\\\") == kj::none\", _kjCondition"
                 ,(char (*) [63])"failed: expected union1g.findFieldByName(\"u0f0s1\") == kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_ab8);
      _kjCondition_11._103_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_ab8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_c68,"u2f0s8");
  StructSchema::findFieldByName(&local_c58,(StructSchema *)&local_2a0,(StringPtr)_auStack_c68);
  kj::_::DebugExpressionStart::operator<<
            (&local_c10,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c58);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator==
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_bc8,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_c10,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_c10);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_c58);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_bc8);
  if (!bVar1) {
    _kjCondition_12._103_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_12._103_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x80,ERROR,
                 "\"failed: expected \" \"union1g.findFieldByName(\\\"u2f0s8\\\") == kj::none\", _kjCondition"
                 ,(char (*) [63])"failed: expected union1g.findFieldByName(\"u2f0s8\") == kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_bc8);
      _kjCondition_12._103_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_bc8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_d78,"noSuchField");
  StructSchema::findFieldByName(&local_d68,(StructSchema *)&local_2a0,(StringPtr)_auStack_d78);
  kj::_::DebugExpressionStart::operator<<
            (&local_d20,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_d68);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator==
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_cd8,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_d20,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_d20);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_d68);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_cd8);
  if (!bVar1) {
    local_d79 = kj::_::Debug::shouldLog(ERROR);
    while (local_d79 != false) {
      kj::_::Debug::
      log<char_const(&)[68],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x81,ERROR,
                 "\"failed: expected \" \"union1g.findFieldByName(\\\"noSuchField\\\") == kj::none\", _kjCondition"
                 ,(char (*) [68])
                  "failed: expected union1g.findFieldByName(\"noSuchField\") == kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_cd8);
      local_d79 = false;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_cd8);
  return;
}

Assistant:

TEST(Schema, Unions) {
  auto schema = Schema::from<TestUnion>().asStruct();

  EXPECT_TRUE(schema.findFieldByName("bit0") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("u1f0s8") == kj::none);

  auto union1 = schema.getFieldByName("union1");
  auto union1g = schema.getDependency(union1.getProto().getGroup().getTypeId()).asStruct();
  EXPECT_EQ(schema, union1g.getDependency(union1g.getProto().getScopeId()));
  EXPECT_TRUE(union1g.findFieldByName("bin0") == kj::none);

  auto u1f0s8 = union1g.getFieldByName("u1f0s8");
  EXPECT_EQ("u1f0s8", u1f0s8.getProto().getName());
  EXPECT_TRUE(u1f0s8.getContainingStruct() == union1g);

  EXPECT_TRUE(union1g.findFieldByName("u1f1s8") != kj::none);
  EXPECT_TRUE(union1g.findFieldByName("u1f0s32") != kj::none);
  EXPECT_TRUE(union1g.findFieldByName("u1f0sp") != kj::none);
  EXPECT_TRUE(union1g.findFieldByName("u1f1s1") != kj::none);

  EXPECT_TRUE(union1g.findFieldByName("u0f0s1") == kj::none);
  EXPECT_TRUE(union1g.findFieldByName("u2f0s8") == kj::none);
  EXPECT_TRUE(union1g.findFieldByName("noSuchField") == kj::none);
}